

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkObj.c
# Opt level: O0

Nwk_Obj_t * Nwk_ManCreateCi(Nwk_Man_t *p,int nFanouts)

{
  int iVar1;
  Nwk_Obj_t *Entry;
  Nwk_Obj_t *pObj;
  int nFanouts_local;
  Nwk_Man_t *p_local;
  
  Entry = Nwk_ManCreateObj(p,1,nFanouts);
  iVar1 = Vec_PtrSize(p->vCis);
  *(uint *)&Entry->field_0x20 = *(uint *)&Entry->field_0x20 & 0x7f | iVar1 << 7;
  Vec_PtrPush(p->vCis,Entry);
  *(uint *)&Entry->field_0x20 = *(uint *)&Entry->field_0x20 & 0xfffffff8 | 1;
  p->nObjs[1] = p->nObjs[1] + 1;
  return Entry;
}

Assistant:

Nwk_Obj_t * Nwk_ManCreateCi( Nwk_Man_t * p, int nFanouts )
{
    Nwk_Obj_t * pObj;
    pObj = Nwk_ManCreateObj( p, 1, nFanouts );
    pObj->PioId = Vec_PtrSize( p->vCis );
    Vec_PtrPush( p->vCis, pObj );
    pObj->Type = NWK_OBJ_CI;
    p->nObjs[NWK_OBJ_CI]++;
    return pObj;
}